

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

int __thiscall
vkt::shaderexecutor::DefaultSampling<int>::genRandom
          (DefaultSampling<int> *this,FloatFormat *param_1,Precision prec,Random *rnd)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int sign;
  int exp;
  Random *rnd_local;
  Precision prec_local;
  FloatFormat *param_1_local;
  DefaultSampling<int> *this_local;
  
  iVar2 = getNumBits(prec);
  iVar2 = de::Random::getInt(rnd,0,iVar2 + -2);
  bVar1 = de::Random::getBool(rnd);
  iVar3 = 1;
  if (bVar1) {
    iVar3 = -1;
  }
  iVar2 = de::Random::getInt(rnd,0,1 << ((byte)iVar2 & 0x1f));
  return iVar3 * iVar2;
}

Assistant:

int		genRandom	(const FloatFormat&, Precision prec, Random& rnd) const
	{
		const int	exp		= rnd.getInt(0, getNumBits(prec)-2);
		const int	sign	= rnd.getBool() ? -1 : 1;

		return sign * rnd.getInt(0, (deInt32)1 << exp);
	}